

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_vt_m_v_deriv(REF_DBL *m,REF_DBL *v,REF_DBL *f,REF_DBL *df_dv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = *v;
  dVar2 = v[1];
  dVar3 = v[2];
  *f = (m[5] * dVar3 + m[2] * dVar1 + dVar2 * m[4]) * dVar3 +
       (m[2] * dVar3 + *m * dVar1 + m[1] * dVar2) * dVar1 +
       (m[4] * dVar3 + m[1] * dVar1 + m[3] * dVar2) * dVar2;
  *df_dv = *m * *v + m[1] * v[1] + m[2] * v[2] + *m * *v + m[1] * v[1] + m[2] * v[2];
  df_dv[1] = m[1] * *v + m[3] * v[1] + m[4] * v[2] + m[1] * *v + m[3] * v[1] + m[4] * v[2];
  df_dv[2] = m[2] * *v + m[4] * v[1] + m[5] * v[2] + m[2] * *v + m[4] * v[1] + m[5] * v[2];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_vt_m_v_deriv(REF_DBL *m, REF_DBL *v, REF_DBL *f,
                                           REF_DBL *df_dv) {
  *f = ((v)[0] * ((m)[0] * (v)[0] + (m)[1] * (v)[1] + (m)[2] * (v)[2]) +
        (v)[1] * ((m)[1] * (v)[0] + (m)[3] * (v)[1] + (m)[4] * (v)[2]) +
        (v)[2] * ((m)[2] * (v)[0] + (m)[4] * (v)[1] + (m)[5] * (v)[2]));

  df_dv[0] = ((m)[0] * (v)[0] + (m)[1] * (v)[1] + (m)[2] * (v)[2]) +
             (v)[0] * (m)[0] + (v)[1] * (m)[1] + (v)[2] * (m)[2];

  df_dv[1] = ((m)[1] * (v)[0] + (m)[3] * (v)[1] + (m)[4] * (v)[2]) +
             (v)[0] * (m)[1] + (v)[1] * (m)[3] + (v)[2] * (m)[4];

  df_dv[2] = ((m)[2] * (v)[0] + (m)[4] * (v)[1] + (m)[5] * (v)[2]) +
             (v)[0] * (m)[2] + (v)[1] * (m)[4] + (v)[2] * (m)[5];

  return REF_SUCCESS;
}